

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerSafe::Resign(Error *__return_storage_ptr__,CommissionerSafe *this)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> local_60;
  promise<ot::commissioner::Error> local_50;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::promise<ot::commissioner::Error>::promise(&local_50);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:219:32)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:219:32)>
             ::_M_manager;
  local_38._M_unused._M_object = &local_50;
  (*(this->super_Commissioner)._vptr_Commissioner[0xf])(this);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__basic_future<ot::commissioner::Error>::__basic_future(&local_60,&local_50._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<ot::commissioner::Error>::~promise(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Resign()
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    Resign(wait);
    return pro.get_future().get();
}